

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

DeviceState __thiscall molly::Device::sample(Device *this)

{
  ssize_t sVar1;
  MollyError *pMVar2;
  int *piVar3;
  char *pcVar4;
  DeviceState DVar5;
  uchar code;
  stringstream msg;
  byte local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (this->_fd == -1) {
    pMVar2 = (MollyError *)__cxa_allocate_exception(0x28);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Device not yet open","");
    MollyError::MollyError(pMVar2,&local_228);
    __cxa_throw(pMVar2,&MollyError::typeinfo,MollyError::~MollyError);
  }
  sVar1 = write(this->_fd,&DAT_0010435c,8);
  if (-1 < sVar1) {
    sVar1 = read(this->_fd,&local_229,1);
    if (sVar1 == 1) {
      DVar5 = (DeviceState)local_229;
      if (2 < (byte)(local_229 - 0x15)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Unexpected response: ",0x15);
        std::ostream::operator<<((ostream *)local_198,(uint)local_229);
        pMVar2 = (MollyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        MollyError::MollyError(pMVar2,&local_208);
        __cxa_throw(pMVar2,&MollyError::typeinfo,MollyError::~MollyError);
      }
    }
    else {
      piVar3 = __errno_location();
      DVar5 = Unavailable;
      if (*piVar3 != 0xb) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198,"Error reading from device: ",0x1b);
        pcVar4 = strerror(*piVar3);
        std::operator<<(local_198,pcVar4);
        pMVar2 = (MollyError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        MollyError::MollyError(pMVar2,&local_1e8);
        __cxa_throw(pMVar2,&MollyError::typeinfo,MollyError::~MollyError);
      }
    }
    return DVar5;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Error writing to device: ",0x19);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(local_198,pcVar4);
  pMVar2 = (MollyError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  MollyError::MollyError(pMVar2,&local_1c8);
  __cxa_throw(pMVar2,&MollyError::typeinfo,MollyError::~MollyError);
}

Assistant:

DeviceState Device::sample()
{
  if (_fd == INVALID_FD)
    throw MollyError("Device not yet open");

  char buf[8] = {0x08, 0, 0, 0, 0, 0, 0, 0x02 };

  ssize_t res = ::write(_fd, buf, 8);

  if (res < 0)
  {
    stringstream msg;
    msg << "Error writing to device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  unsigned char code;
  res = read(_fd, &code, 1);

  if (res != 1)
  {
    if (errno == EAGAIN)
      return DeviceState::Unavailable;

    stringstream msg;
    msg << "Error reading from device: " << strerror(errno);
    throw MollyError(msg.str());
  }

  switch (code)
  {
    case (unsigned char)DeviceState::ButtonPressed:
      return DeviceState::ButtonPressed;
    case (unsigned char)DeviceState::LidClosed:
      return DeviceState::LidClosed;
    case (unsigned char)DeviceState::LidOpen:
      return DeviceState::LidOpen;
    default:
      stringstream msg;
      msg << "Unexpected response: " << (int)code;
      throw MollyError(msg.str());
  }
}